

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjAlloc(Cba_Ntk_t *p,Cba_ObjType_t Type,int nFins,int nFons)

{
  int Entry;
  int iVar1;
  bool bVar2;
  long lStack_40;
  
  Entry = (p->vObjType).nSize;
  if (Type == CBA_OBJ_PI) {
    lStack_40 = 0x18;
  }
  else {
    if (Type != CBA_OBJ_PO) goto LAB_0035b3e0;
    lStack_40 = 0x28;
  }
  Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lStack_40),Entry);
LAB_0035b3e0:
  Vec_StrPush(&p->vObjType,(char)Type);
  if (nFins < 1) {
    nFins = 0;
  }
  while (bVar2 = nFins != 0, nFins = nFins + -1, bVar2) {
    Vec_IntPush(&p->vFinFon,0);
  }
  if ((p->vObjFin0).nSize != 0) {
    Vec_IntPush(&p->vObjFin0,(p->vFinFon).nSize);
  }
  iVar1 = 0;
  if (0 < nFons) {
    iVar1 = nFons;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    Vec_IntPush(&p->vFonObj,Entry);
  }
  if ((p->vObjFon0).nSize != 0) {
    Vec_IntPush(&p->vObjFon0,(p->vFonObj).nSize);
  }
  return Entry;
}

Assistant:

static inline int Cba_ObjAlloc( Cba_Ntk_t * p, Cba_ObjType_t Type, int nFins, int nFons )
{
    int i, iObj = Vec_StrSize(&p->vObjType);
    if ( Type == CBA_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == CBA_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vObjType, (char)Type );
    // add fins
    for ( i = 0; i < nFins; i++ )
        Vec_IntPush( &p->vFinFon, 0 );
    if ( Vec_IntSize(&p->vObjFin0) )
        Vec_IntPush( &p->vObjFin0, Vec_IntSize(&p->vFinFon) );
    // add fons
    for ( i = 0; i < nFons; i++ )
        Vec_IntPush( &p->vFonObj, iObj );
    if ( Vec_IntSize(&p->vObjFon0) )
        Vec_IntPush( &p->vObjFon0, Vec_IntSize(&p->vFonObj) );
    return iObj;
}